

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

uint32_t mipsdsp_lshift32(uint32_t a,uint8_t s,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,s) != 0) {
    if (((int)a >> (-s & 0x1f)) - 1U < 0xfffffffe) {
      pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
      *pbVar1 = *pbVar1 | 0x40;
    }
    a = a << (s & 0x1f);
  }
  return a;
}

Assistant:

static inline uint32_t mipsdsp_lshift32(uint32_t a, uint8_t s,
                                        CPUMIPSState *env)
{
    uint32_t discard;

    if (s == 0) {
        return a;
    } else {
        discard = (int32_t)a >> (31 - (s - 1));

        if ((discard != 0x00000000) && (discard != 0xFFFFFFFF)) {
            set_DSPControl_overflow_flag(1, 22, env);
        }
        return a << s;
    }
}